

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::hasAdditionalOps(string *unit_string)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  char in_stack_ffffffffffffffdf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff7;
  undefined1 uVar2;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_last_of
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf,0x7945b9);
  sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find_last_of(unaff_retaddr,(char *)in_RDI,
                       CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0));
  uVar2 = true;
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find_last_of
              (in_RDI,in_stack_ffffffffffffffdf,0x7945fc);
    sVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of(unaff_retaddr,(char *)in_RDI,CONCAT17(uVar2,in_stack_fffffffffffffff0));
    uVar2 = sVar1 != 0xffffffffffffffff;
  }
  return (bool)uVar2;
}

Assistant:

static bool hasAdditionalOps(const std::string& unit_string)
{
    return (unit_string.find_last_of("*^(/", unit_string.find_last_of('{')) !=
            std::string::npos) ||
        (unit_string.find_first_of("*^(/", unit_string.find_last_of('}')) !=
         std::string::npos);
}